

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O3

int main(void)

{
  long *source_end;
  input_char *piVar1;
  wchar_t *pwVar2;
  long *source_begin;
  bool bVar3;
  int iVar4;
  wchar_t *pwVar5;
  char *pcVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  input_char *piVar9;
  wchar_t buf [6];
  ostringstream ss;
  wstring whello;
  string hello;
  char buf_1 [3];
  basic_stackstring<wchar_t,_char,_5UL> local_238;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined8 local_208;
  long *local_1f0 [2];
  long local_1e0 [45];
  wchar_t *local_78;
  long local_70;
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  char local_33 [3];
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,anon_var_dwarf_3d4b,anon_var_dwarf_3d4b + 8);
  local_78 = (wchar_t *)local_68;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_78,L"שלום",L"");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- nowide::widen",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  source_begin = local_58;
  source_end = local_58 + 1;
  local_218 = (undefined1  [8])0x0;
  uStack_210 = (output_char_conflict *)0x0;
  local_208 = (output_char *)0x100000000;
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,5,(char *)local_58,(char *)source_end);
  if (pwVar5 != (wchar_t *)local_218) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::widen(buf,5,b,e)==buf in ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_78);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error buf == whello in ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_208._4_4_ != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error buf[5] == 1 in ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,4,(char *)source_begin,(char *)source_end);
  if (pwVar5 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::widen(buf,4,b,e)==0 in ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,5,(char *)source_begin,(char *)((long)source_begin + 7));
  if (pwVar5 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::widen(buf,5,b,e-1)==0 in ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,5,(char *)source_begin,(char *)((long)source_begin + 6));
  if (pwVar5 != (wchar_t *)local_218) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::widen(buf,5,b,e-2)==buf in ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,5,(char *)source_begin,(char *)((long)source_begin + 2));
  if (((pwVar5 != (wchar_t *)local_218) || (local_218._4_4_ != 0)) || (local_218._0_4_ != *local_78)
     ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "Error nowide::widen(buf,5,b,b+2)==buf && buf[1]==0 && buf[0]==whello[0] in ",0x4b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,5,anon_var_dwarf_3e86,anon_var_dwarf_3e86 + 2);
  if (pwVar5 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::widen(buf,5,b,e)==0 in ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,5,anon_var_dwarf_3ea6,anon_var_dwarf_3ea6 + 3);
  if (pwVar5 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::widen(buf,5,b,e)==0 in ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pwVar5 = nowide::basic_convert<wchar_t,char>
                     ((wchar_t *)local_218,5,anon_var_dwarf_3ea6,anon_var_dwarf_3ea6 + 1);
  if (pwVar5 != (wchar_t *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::widen(buf,5,b,b+1)==0 in ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- nowide::narrow",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  pwVar2 = local_78;
  pwVar5 = local_78 + 4;
  local_218[0] = '\0';
  local_218[1] = '\0';
  local_218[2] = '\0';
  local_218[3] = '\0';
  local_218[4] = '\0';
  local_218._5_3_ = 0;
  uStack_210 = (output_char_conflict *)CONCAT62(uStack_210._2_6_,0x100);
  pcVar6 = nowide::basic_convert<char,wchar_t>(local_218,9,local_78,pwVar5);
  if (pcVar6 != local_218) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::narrow(buf,9,b,e)==buf in ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error buf == hello in ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uStack_210._1_1_ != '\x01') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error buf[9] == 1 in ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = nowide::basic_convert<char,wchar_t>(local_218,8,pwVar2,pwVar5);
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::narrow(buf,8,b,e)==0 in ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar6 = nowide::basic_convert<char,wchar_t>(local_218,7,pwVar2,pwVar2 + 3);
  if (pcVar6 != local_218) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error nowide::narrow(buf,7,b,e-1)==buf in ",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)local_1f0,(ulong)&local_58);
  iVar4 = std::__cxx11::string::compare((char *)local_1f0);
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] + 1);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"Error buf==hello.substr(0,6) in ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nowide::basic_convert<char,wchar_t>(local_33,3,L"xy",L"");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"xy","");
  iVar4 = std::__cxx11::string::compare((char *)local_1f0);
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] + 1);
  }
  if (iVar4 == 0) {
    nowide::basic_convert<wchar_t,char>((wchar_t *)local_218,3,"xy","");
    local_1f0[0] = local_1e0;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1f0,L"xy",L"");
    iVar4 = std::__cxx11::wstring::compare((wchar_t *)local_1f0);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] * 4 + 4);
    }
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "Error nowide::widen(wbuf,3,\"xy\")==std::wstring(L\"xy\") in ",0x39);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x39);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"- nowide::stackstring",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    local_208 = (output_char *)0x0;
    piVar9 = (input_char *)((long)local_58 + -1);
    do {
      piVar1 = piVar9 + 1;
      piVar9 = piVar9 + 1;
    } while (*piVar1 != '\0');
    bVar3 = nowide::basic_stackstring<wchar_t,_char,_3UL>::convert
                      ((basic_stackstring<wchar_t,_char,_3UL> *)local_218,(input_char *)local_58,
                       piVar9);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.convert(hello.c_str()) in ",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x3f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_78);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == whello in ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = nowide::basic_stackstring<wchar_t,_char,_3UL>::convert
                      ((basic_stackstring<wchar_t,_char,_3UL> *)local_218,(input_char *)local_58,
                       (input_char *)((long)local_58 + local_50));
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "Error sw.convert(hello.c_str(),hello.c_str()+hello.size()) in ",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x41);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_78);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == whello in ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x42);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_208 != (output_char *)0x0) {
      operator_delete__(local_208);
    }
    local_238.mem_buffer_ = (output_char *)0x0;
    piVar9 = (input_char *)((long)local_58 + -1);
    do {
      piVar1 = piVar9 + 1;
      piVar9 = piVar9 + 1;
    } while (*piVar1 != '\0');
    bVar3 = nowide::basic_stackstring<wchar_t,_char,_5UL>::convert
                      (&local_238,(input_char *)local_58,piVar9);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.convert(hello.c_str()) in ",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_218[0] = ':';
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,local_218,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x46);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)local_218);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_78);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == whello in ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_218[0] = ':';
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,local_218,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x47);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)local_218);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = nowide::basic_stackstring<wchar_t,_char,_5UL>::convert
                      (&local_238,(input_char *)local_58,(input_char *)((long)local_58 + local_50));
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "Error sw.convert(hello.c_str(),hello.c_str()+hello.size()) in ",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_218[0] = ':';
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,local_218,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)local_218);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_78);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == whello in ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_218[0] = ':';
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,local_218,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x49);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)local_218);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_238.mem_buffer_ != (output_char *)0x0) {
      operator_delete__(local_238.mem_buffer_);
    }
    uStack_210 = (output_char_conflict *)0x0;
    pwVar5 = local_78 + -1;
    do {
      pwVar2 = pwVar5 + 1;
      pwVar5 = pwVar5 + 1;
    } while (*pwVar2 != L'\0');
    bVar3 = nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
                      ((basic_stackstring<char,_wchar_t,_5UL> *)local_218,local_78,pwVar5);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.convert(whello.c_str()) in ",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == hello in ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
                      ((basic_stackstring<char,_wchar_t,_5UL> *)local_218,local_78,
                       local_78 + local_70);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "Error sw.convert(whello.c_str(),whello.c_str()+whello.size()) in ",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == hello in ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (uStack_210 != (output_char_conflict *)0x0) {
      operator_delete__(uStack_210);
    }
    local_208 = (output_char *)0x0;
    pwVar5 = local_78 + -1;
    do {
      pwVar2 = pwVar5 + 1;
      pwVar5 = pwVar5 + 1;
    } while (*pwVar2 != L'\0');
    bVar3 = nowide::basic_stackstring<char,_wchar_t,_10UL>::convert
                      ((basic_stackstring<char,_wchar_t,_10UL> *)local_218,local_78,pwVar5);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.convert(whello.c_str()) in ",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x54);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == hello in ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x55);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = nowide::basic_stackstring<char,_wchar_t,_10UL>::convert
                      ((basic_stackstring<char,_wchar_t,_10UL> *)local_218,local_78,
                       local_78 + local_70);
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar4 == 0) {
        if (local_208 != (output_char *)0x0) {
          operator_delete__(local_208);
        }
        if (local_78 != (wchar_t *)local_68) {
          operator_delete(local_78,local_68[0] * 4 + 4);
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed",6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
        return 0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error sw.c_str() == hello in ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
                 ,99);
      local_238.buffer_[0]._0_1_ = 0x3a;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)&local_238,1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x57);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_238);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "Error sw.convert(whello.c_str(),whello.c_str()+whello.size()) in ",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
               ,99);
    local_238.buffer_[0]._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(char *)&local_238,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x56);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_238);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f0,"Error nowide::narrow(buf,3,L\"xy\")==std::string(\"xy\") in ",
             0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_convert.cpp"
             ,99);
  local_238.buffer_[0]._0_1_ = 0x3a;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1f0,(char *)&local_238,1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar8,(string *)&local_238);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string hello = "\xd7\xa9\xd7\x9c\xd7\x95\xd7\x9d";
        std::wstring whello = L"\u05e9\u05dc\u05d5\u05dd";
        std::cout << "- nowide::widen" << std::endl;
        {
            char const *b=hello.c_str();
            char const *e=b+8;
            wchar_t buf[6] = { 0,0,0,0,0,1 };
            TEST(nowide::widen(buf,5,b,e)==buf);
            TEST(buf == whello);
            TEST(buf[5] == 1);
            TEST(nowide::widen(buf,4,b,e)==0);
            TEST(nowide::widen(buf,5,b,e-1)==0);
            TEST(nowide::widen(buf,5,b,e-2)==buf);
            TEST(nowide::widen(buf,5,b,b)==buf && buf[0]==0);
            TEST(nowide::widen(buf,5,b,b+2)==buf && buf[1]==0 && buf[0]==whello[0]);
            b="\xFF\xFF";
            e=b+2;
            TEST(nowide::widen(buf,5,b,e)==0);
            b="\xd7\xa9\xFF";
            e=b+3;
            TEST(nowide::widen(buf,5,b,e)==0);
            TEST(nowide::widen(buf,5,b,b+1)==0);
        }
        std::cout << "- nowide::narrow" << std::endl;
        {
            wchar_t const *b=whello.c_str();
            wchar_t const *e=b+4;
            char buf[10] = {0};
            buf[9]=1;
            TEST(nowide::narrow(buf,9,b,e)==buf);
            TEST(buf == hello);
            TEST(buf[9] == 1);
            TEST(nowide::narrow(buf,8,b,e)==0);
            TEST(nowide::narrow(buf,7,b,e-1)==buf);
            TEST(buf==hello.substr(0,6));
        }
        {
            char buf[3];
            wchar_t wbuf[3];
            TEST(nowide::narrow(buf,3,L"xy")==std::string("xy"));
            TEST(nowide::widen(wbuf,3,"xy")==std::wstring(L"xy"));
        }
        std::cout << "- nowide::stackstring" << std::endl;
        {
            {
                nowide::basic_stackstring<wchar_t,char,3> sw;
                TEST(sw.convert(hello.c_str()));
                TEST(sw.c_str() == whello);
                TEST(sw.convert(hello.c_str(),hello.c_str()+hello.size()));
                TEST(sw.c_str() == whello);
            }
            {
                nowide::basic_stackstring<wchar_t,char,5> sw;
                TEST(sw.convert(hello.c_str()));
                TEST(sw.c_str() == whello);
                TEST(sw.convert(hello.c_str(),hello.c_str()+hello.size()));
                TEST(sw.c_str() == whello);
            }
            {
                nowide::basic_stackstring<char,wchar_t,5> sw;
                TEST(sw.convert(whello.c_str()));
                TEST(sw.c_str() == hello);
                TEST(sw.convert(whello.c_str(),whello.c_str()+whello.size()));
                TEST(sw.c_str() == hello);
            }
            {
                nowide::basic_stackstring<char,wchar_t,10> sw;
                TEST(sw.convert(whello.c_str()));
                TEST(sw.c_str() == hello);
                TEST(sw.convert(whello.c_str(),whello.c_str()+whello.size()));
                TEST(sw.c_str() == hello);
            }
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Failed :" << e.what() << std::endl;
        return 1;
    }
    std::cout << "Passed" << std::endl;
    return 0;
}